

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O3

Var Js::ProfilingHelpers::ProfiledLdElem
              (Var base,Var varIndex,FunctionBody *functionBody,ProfileId profileId,
              bool didArrayAccessHelperCall,bool bailedOutOnArraySpecialization)

{
  Type TVar1;
  long lVar2;
  SparseArraySegmentBase *pSVar3;
  code *pcVar4;
  bool bVar5;
  char cVar6;
  FldInfoFlags oldFlags;
  FldInfoFlags newFlags;
  bool expectingVarArray;
  ObjectType OVar7;
  undefined4 *puVar8;
  JavascriptCopyOnAccessNativeIntArray *this;
  JavascriptArray *pJVar9;
  ScriptContext *pSVar10;
  Var var;
  DynamicProfileInfo *pDVar11;
  INT_PTR IVar12;
  RecyclableObject *this_00;
  undefined6 in_register_0000000a;
  anon_union_2_4_ea848c7b_for_ValueType_13 *recyclableObject;
  FunctionBody *pFVar13;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_68;
  undefined6 uStack_66;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  FunctionBody *local_58;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_50;
  undefined2 uStack_4e;
  undefined4 uStack_4c;
  RecyclableObject *cacheOwner;
  undefined4 local_40;
  TypeId arrayTypeId;
  undefined1 local_38;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_34;
  bool isObjectWithArray;
  ValueType arrayType;
  
  local_40 = (undefined4)CONCAT62(in_register_0000000a,profileId);
  local_58 = functionBody;
  if (base == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x13,"(base)","base");
    if (!bVar5) goto LAB_00af4934;
    *puVar8 = 0;
  }
  if (varIndex == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x14,"(varIndex)","varIndex");
    if (!bVar5) goto LAB_00af4934;
    *puVar8 = 0;
  }
  if (local_58 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x15,"(functionBody)","functionBody");
    if (!bVar5) goto LAB_00af4934;
    *puVar8 = 0;
  }
  if ((ProfileId)local_40 == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x16,"(profileId != Constants::NoProfileId)",
                                "profileId != Constants::NoProfileId");
    if (!bVar5) goto LAB_00af4934;
    *puVar8 = 0;
  }
  ValueType::ValueType((ValueType *)&local_36.field_0);
  ValueType::ValueType((ValueType *)&stack0xffffffffffffffcc);
  arrayType.field_0.bits._1_1_ = bailedOutOnArraySpecialization * '\x04' + '\x01';
  arrayType.field_0.bits._0_1_ = 0;
  if (((base != (Var)0x0) && (bVar5 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(base), bVar5))
     && (this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(base),
        this != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
  }
  bVar5 = VarIs<Js::RecyclableObject>(base);
  if ((bVar5) && (*base == VirtualTableInfo<Js::JavascriptArray>::Address)) {
    pJVar9 = UnsafeVarTo<Js::JavascriptArray>(base);
    local_50.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::FromArray(Array,pJVar9,TypeIds_Array);
    local_36.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)&local_50.field_0);
    pFVar13 = local_58;
    pSVar10 = FunctionProxy::GetScriptContext((FunctionProxy *)local_58);
    var = ProfiledLdElem_FastPath(pJVar9,varIndex,pSVar10,(LdElemInfo *)&local_36.field_0);
    aStack_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Merge((ValueType *)&stack0xffffffffffffffcc,var);
    pDVar11 = FunctionBody::GetDynamicProfileInfo(pFVar13);
    goto LAB_00af491d;
  }
  pJVar9 = JavascriptArray::GetArrayForArrayOrObjectWithArray
                     (base,(bool *)((long)&arrayTypeId + 1),(TypeId *)((long)&cacheOwner + 4));
  if (didArrayAccessHelperCall) {
    arrayType.field_0.bits._1_1_ = arrayType.field_0.bits._1_1_ | 2;
  }
  if (pJVar9 == (JavascriptArray *)0x0) {
    recyclableObject = &local_50;
    bVar5 = TypedArrayBase::TryGetLengthForOptimizedTypedArray
                      (base,(uint32 *)&recyclableObject->bits,(TypeId *)((long)&cacheOwner + 4));
    if (bVar5) {
      lVar2 = *base;
      propertyRecordUsageCache = (PropertyRecordUsageCache *)pJVar9;
      IVar12 = ValueType::GetVirtualTypedArrayVtable(cacheOwner._4_4_);
      local_68.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromTypeId(cacheOwner._4_4_,lVar2 == IVar12);
      local_36.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&local_68.field_0);
      goto LAB_00af468b;
    }
    bVar5 = VarIs<Js::RecyclableObject>(base);
    if (bVar5) {
      this_00 = UnsafeVarTo<Js::RecyclableObject>(base);
      local_68.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromObject
                     ((ValueType *)this_00,(RecyclableObject *)&recyclableObject->field_0);
      local_36.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&local_68.field_0);
    }
  }
  else {
    if (arrayTypeId._1_1_ == 1) {
      local_50.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromObjectArray(pJVar9);
    }
    else {
      local_50.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromArray(Array,pJVar9,cacheOwner._4_4_);
    }
    local_36.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)&local_50.field_0);
    pSVar3 = (pJVar9->head).ptr;
    if (pSVar3->left != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x4c,"(head->left == 0)","head->left == 0");
      if (!bVar5) goto LAB_00af4934;
      *puVar8 = 0;
    }
    TVar1 = pSVar3->length;
    local_50.bits = (Type)TVar1;
    uStack_4e = (undefined2)(TVar1 >> 0x10);
    propertyRecordUsageCache = (PropertyRecordUsageCache *)pJVar9;
LAB_00af468b:
    if (((ulong)varIndex & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)varIndex & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)varIndex & 0xffff000000000000) != 0x1000000000000) {
        arrayType.field_0.bits._1_1_ = arrayType.field_0.bits._1_1_ | 2;
        pJVar9 = (JavascriptArray *)propertyRecordUsageCache;
        goto LAB_00af47db;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_00af4934;
      *puVar8 = 0;
    }
    pJVar9 = (JavascriptArray *)propertyRecordUsageCache;
    if (((ulong)varIndex & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) {
LAB_00af4934:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    if ((((int)(uint)varIndex < 0) || (CONCAT22(uStack_4e,local_50.bits) <= (uint)varIndex)) ||
       ((pJVar9 != (JavascriptArray *)0x0 &&
        (cVar6 = (**(code **)&(((PropertyRecordUsageCache *)pJVar9)->propertyRecord).ptr[0x27].
                              isNumeric)(pJVar9,(ulong)varIndex & 0xffffffff), cVar6 != '\0')))) {
      arrayType.field_0.bits._1_1_ = arrayType.field_0.bits._1_1_ | 2;
    }
  }
LAB_00af47db:
  pSVar10 = FunctionProxy::GetScriptContext((FunctionProxy *)local_58);
  bVar5 = JavascriptOperators::GetPropertyRecordUsageCache
                    (varIndex,pSVar10,(PropertyRecordUsageCache **)&local_68,
                     (RecyclableObject **)&local_50);
  if (bVar5) {
    arrayTypeId._2_2_ = TypeIds_Undefined >> 0x10;
    local_38 = 0;
    var = JavascriptOperators::GetElementIWithCache<true>
                    (base,(RecyclableObject *)CONCAT44(uStack_4c,CONCAT22(uStack_4e,local_50.bits)),
                     (PropertyRecordUsageCache *)CONCAT62(uStack_66,local_68.bits),pSVar10,
                     (PropertyCacheOperationInfo *)((long)&arrayTypeId + 2));
    oldFlags = DynamicProfileInfo::FldInfoFlagsFromCacheType(arrayTypeId._2_1_);
    arrayType.field_0.bits._0_1_ = oldFlags;
    newFlags = DynamicProfileInfo::FldInfoFlagsFromSlotType(arrayTypeId._3_1_);
    arrayType.field_0.bits._0_1_ = DynamicProfileInfo::MergeFldInfoFlags(oldFlags,newFlags);
  }
  else {
    var = JavascriptOperators::OP_GetElementI(base,varIndex,pSVar10);
  }
  arrayTypeId._2_2_ = local_36.bits;
  bVar5 = ValueType::IsUninitialized((ValueType *)((long)&arrayTypeId + 2));
  pFVar13 = local_58;
  if ((bVar5) && (arrayType.field_0.bits._0_1_ == '\0')) {
    pDVar11 = FunctionBody::GetDynamicProfileInfo(local_58);
    DynamicProfileInfo::RecordElementLoadAsProfiled(pDVar11,pFVar13,(ProfileId)local_40);
    return var;
  }
  if ((((pJVar9 != (JavascriptArray *)0x0) &&
       (bVar5 = ValueType::IsLikelyObject((ValueType *)((long)&arrayTypeId + 2)), bVar5)) &&
      (OVar7 = ValueType::GetObjectType((ValueType *)((long)&arrayTypeId + 2)), OVar7 == Array)) &&
     (bVar5 = ValueType::HasIntElements((ValueType *)((long)&arrayTypeId + 2)), !bVar5)) {
    bVar5 = ValueType::HasFloatElements((ValueType *)((long)&arrayTypeId + 2));
    expectingVarArray = ValueType::HasVarElements((ValueType *)((long)&arrayTypeId + 2));
    JavascriptOperators::UpdateNativeArrayProfileInfoToCreateVarArray
              (pJVar9,bVar5,expectingVarArray);
  }
  aStack_34.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::Merge(&ValueType::Uninitialized,var);
  pFVar13 = local_58;
  pDVar11 = FunctionBody::GetDynamicProfileInfo(local_58);
LAB_00af491d:
  DynamicProfileInfo::RecordElementLoad
            (pDVar11,pFVar13,(ProfileId)local_40,(LdElemInfo *)&local_36.field_0);
  return var;
}

Assistant:

Var ProfilingHelpers::ProfiledLdElem(
        const Var base,
        const Var varIndex,
        FunctionBody *const functionBody,
        const ProfileId profileId,
        bool didArrayAccessHelperCall,
        bool bailedOutOnArraySpecialization)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledLdElem);
        Assert(base);
        Assert(varIndex);
        Assert(functionBody);
        Assert(profileId != Constants::NoProfileId);

        LdElemInfo ldElemInfo;

        if (bailedOutOnArraySpecialization)
        {
            ldElemInfo.disableAggressiveSpecialization = true;
        }

        // Only enable fast path if the javascript array is not cross site
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(base);
#endif
        const bool isJsArray = !TaggedNumber::Is(base) && VirtualTableInfo<JavascriptArray>::HasVirtualTable(base);
        const bool fastPath = isJsArray;
        if(fastPath)
        {
            JavascriptArray *const array = UnsafeVarTo<JavascriptArray>(base);
            ldElemInfo.arrayType = ValueType::FromArray(ObjectType::Array, array, TypeIds_Array).ToLikely();

            const Var element = ProfiledLdElem_FastPath(array, varIndex, functionBody->GetScriptContext(), &ldElemInfo);

            ldElemInfo.elemType = ldElemInfo.elemType.Merge(element);
            functionBody->GetDynamicProfileInfo()->RecordElementLoad(functionBody, profileId, ldElemInfo);
            return element;
        }

        Assert(!isJsArray);
        bool isObjectWithArray;
        TypeId arrayTypeId;
        JavascriptArray *const array =
            JavascriptArray::GetArrayForArrayOrObjectWithArray(base, &isObjectWithArray, &arrayTypeId);

        if (didArrayAccessHelperCall)
        {
            ldElemInfo.neededHelperCall = true;
        }

        do // while(false)
        {
            // The fast path is only for JavascriptArray and doesn't cover native arrays, objects with internal arrays, or typed
            // arrays, but we still need to profile the array

            uint32 headSegmentLength;
            if(array)
            {
                ldElemInfo.arrayType =
                    (
                        isObjectWithArray
                            ? ValueType::FromObjectArray(array)
                            : ValueType::FromArray(ObjectType::Array, array, arrayTypeId)
                    ).ToLikely();

                SparseArraySegmentBase *const head = array->GetHead();
                Assert(head->left == 0);
                headSegmentLength = head->length;
            }
            else if(TypedArrayBase::TryGetLengthForOptimizedTypedArray(base, &headSegmentLength, &arrayTypeId))
            {
                bool isVirtual = (VirtualTableInfoBase::GetVirtualTable(base) == ValueType::GetVirtualTypedArrayVtable(arrayTypeId));
                ldElemInfo.arrayType = ValueType::FromTypeId(arrayTypeId, isVirtual).ToLikely();
            }
            else if(Js::VarIs<Js::RecyclableObject>(base))
            {
                ldElemInfo.arrayType = ValueType::FromObject(Js::UnsafeVarTo<Js::RecyclableObject>(base)).ToLikely();
                break;
            }
            else
            {
                break;
            }

            if(!TaggedInt::Is(varIndex))
            {
                ldElemInfo.neededHelperCall = true;
                break;
            }

            const int32 index = TaggedInt::ToInt32(varIndex);
            const uint32 offset = index;
            if(index < 0 || offset >= headSegmentLength || (array && array->IsMissingHeadSegmentItem(offset)))
            {
                ldElemInfo.neededHelperCall = true;
                break;
            }
        } while(false);

        ScriptContext* scriptContext = functionBody->GetScriptContext();
        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        Var element = nullptr;
        if (JavascriptOperators::GetPropertyRecordUsageCache(varIndex, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            PropertyCacheOperationInfo operationInfo;
            element = JavascriptOperators::GetElementIWithCache<true /* ReturnOperationInfo */>(base, cacheOwner, propertyRecordUsageCache, scriptContext, &operationInfo);

            ldElemInfo.flags = DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType);
            ldElemInfo.flags = DynamicProfileInfo::MergeFldInfoFlags(ldElemInfo.flags, DynamicProfileInfo::FldInfoFlagsFromSlotType(operationInfo.slotType));
        }
        else
        {
            element = JavascriptOperators::OP_GetElementI(base, varIndex, scriptContext);
        }

        const ValueType arrayType(ldElemInfo.GetArrayType());
        if(!arrayType.IsUninitialized() || ldElemInfo.flags != Js::FldInfo_NoInfo)
        {
            if(array && arrayType.IsLikelyObject() && arrayType.GetObjectType() == ObjectType::Array && !arrayType.HasIntElements())
            {
                JavascriptOperators::UpdateNativeArrayProfileInfoToCreateVarArray(
                    array,
                    arrayType.HasFloatElements(),
                    arrayType.HasVarElements());
            }

            ldElemInfo.elemType = ValueType::Uninitialized.Merge(element);

            functionBody->GetDynamicProfileInfo()->RecordElementLoad(functionBody, profileId, ldElemInfo);
            return element;
        }

        functionBody->GetDynamicProfileInfo()->RecordElementLoadAsProfiled(functionBody, profileId);
        return element;
        JIT_HELPER_END(ProfiledLdElem);
    }